

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string *printable_name)

{
  FieldDescriptor *pFVar1;
  int iVar2;
  long lVar3;
  once_flag *poVar4;
  anon_union_8_8_13f84498_for_Symbol_2 aVar5;
  long lVar6;
  Symbol SVar7;
  FieldDescriptor *local_40;
  FieldDescriptor *local_38;
  
  if (*(int *)(extendee + 0x78) != 0) {
    SVar7 = Tables::FindByNameHelper
                      ((this->tables_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                       _M_head_impl,this,printable_name);
    aVar5 = SVar7.field_1;
    if (((SVar7.type == FIELD) &&
        (*(FieldDescriptor *)(aVar5.descriptor + 0x42) == (FieldDescriptor)0x1)) &&
       (*(Descriptor **)(aVar5.descriptor + 0x50) == extendee)) {
      return (FieldDescriptor *)aVar5.descriptor;
    }
    if (*(char *)(*(long *)(extendee + 0x20) + 0x48) == '\x01') {
      SVar7 = Tables::FindByNameHelper
                        ((this->tables_)._M_t.
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                         _M_head_impl,this,printable_name);
      aVar5 = SVar7.field_1;
      if ((aVar5.descriptor != (Descriptor *)0x0 && SVar7.type == MESSAGE) &&
         (iVar2 = *(int *)(aVar5.descriptor + 0x7c), 0 < (long)iVar2)) {
        lVar6 = 0;
        do {
          lVar3 = *(long *)(aVar5.descriptor + 0x50);
          if (*(Descriptor **)(lVar3 + 0x50 + lVar6) == extendee) {
            pFVar1 = (FieldDescriptor *)(lVar6 + lVar3);
            poVar4 = *(once_flag **)(lVar3 + 0x30 + lVar6);
            if (poVar4 != (once_flag *)0x0) {
              local_40 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
              local_38 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar4,(_func_void_FieldDescriptor_ptr **)&local_40,&local_38);
            }
            if ((*(int *)(lVar3 + 0x38 + lVar6) == 0xb) && (*(int *)(lVar3 + 0x3c + lVar6) == 1)) {
              poVar4 = *(once_flag **)(lVar3 + 0x30 + lVar6);
              if (poVar4 != (once_flag *)0x0) {
                local_40 = pFVar1;
                std::
                call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (poVar4,FieldDescriptor::TypeOnceInit,&local_40);
              }
              if (*(Descriptor **)(lVar3 + 0x68 + lVar6) == aVar5.descriptor) {
                return pFVar1;
              }
            }
          }
          lVar6 = lVar6 + 0x98;
        } while ((long)iVar2 * 0x98 - lVar6 != 0);
      }
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, const std::string& printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}